

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZElementMatrixT.cpp
# Opt level: O0

void __thiscall
TPZElementMatrixT<std::complex<double>_>::ApplyConstraints
          (TPZElementMatrixT<std::complex<double>_> *this)

{
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int64_t iVar9;
  ostream *poVar10;
  pointer pTVar11;
  size_type sVar12;
  reference plVar13;
  long *plVar14;
  TPZConnect *pTVar15;
  int64_t iVar16;
  long lVar17;
  complex<double> *pcVar18;
  complex<double> *pcVar19;
  int *piVar20;
  long lVar21;
  size_type sVar22;
  long *in_RDI;
  int64_t col;
  pair<std::_Rb_tree_const_iterator<long>,_bool> pVar23;
  int numstate;
  int idf;
  STATE coef;
  int ieq_1;
  int64_t receive;
  int64_t send;
  int64_t depsize;
  int64_t deppos;
  int depindex;
  int64_t depnodeindex;
  TPZDepend *dep;
  int64_t insize;
  int64_t inpos;
  TPZConnect *dfn_1;
  int64_t dfnindex_1;
  int in_1;
  int current_order;
  int numnodes_processed;
  int64_t jr;
  int64_t j;
  int64_t jrfirst;
  int64_t jlast;
  int64_t jfirst;
  int64_t jdfn;
  int jrnode;
  int jn;
  int64_t ieq;
  int64_t ir;
  int64_t i_1;
  int64_t irfirst;
  int64_t ilast;
  int64_t ifirst;
  int64_t idfn;
  int irnode;
  int numnod;
  int64_t nrhs;
  int ndfcheck;
  int ndf;
  TPZConnect *dfn;
  int64_t dfnindex;
  int64_t toteq;
  TPZVec<int> DependenceOrder;
  int64_t i;
  iterator it;
  int c;
  iterator it_1;
  set<long,_std::less<long>,_std::allocator<long>_> connectlist;
  set<long,_std::less<long>,_std::allocator<long>_> origlist;
  int in;
  int totalnodes;
  undefined4 in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffbac;
  TPZCompMesh *in_stack_fffffffffffffbb0;
  TPZConnect *in_stack_fffffffffffffbb8;
  int64_t in_stack_fffffffffffffbc0;
  TPZBlock *in_stack_fffffffffffffbc8;
  TPZFMatrix<double> *in_stack_fffffffffffffbd0;
  TPZBlock *in_stack_fffffffffffffbd8;
  TPZCompMesh *in_stack_fffffffffffffbe0;
  set<long,_std::less<long>,_std::allocator<long>_> *in_stack_fffffffffffffbe8;
  set<long,_std::less<long>,_std::allocator<long>_> *in_stack_fffffffffffffbf0;
  long *in_stack_fffffffffffffbf8;
  TPZVec<long> *in_stack_fffffffffffffc00;
  TPZCompMesh *in_stack_fffffffffffffc08;
  TPZVec<int> *in_stack_fffffffffffffc10;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  int local_224;
  int local_214;
  long local_210;
  long local_208;
  int local_1ec;
  TPZDepend *local_1e0;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  long local_1a0;
  int local_178;
  int local_174;
  long local_170;
  long local_160;
  int local_138;
  long local_110;
  TPZVec<int> local_108;
  _Base_ptr local_e8;
  ulong local_e0;
  _Base_ptr local_d8;
  _List_node_base *local_d0;
  _Base_ptr local_c8;
  undefined1 local_c0;
  int local_b4;
  _Self local_b0;
  _Self local_a8;
  _Base_ptr local_a0;
  undefined1 local_98;
  size_t in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  int local_1c;
  
  iVar9 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0x3e));
  if (iVar9 == 0) {
    poVar10 = std::operator<<((ostream *)&std::cout,"this->fMat not initialized");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  }
  iVar4 = TPZElementMatrix::NConnects((TPZElementMatrix *)0x1ac7950);
  TPZManVector<long,_10>::Resize
            ((TPZManVector<long,_10> *)in_stack_fffffffffffffbe0,(int64_t)in_stack_fffffffffffffbd8)
  ;
  if (iVar4 != 0) {
    TPZVec<long>::Fill(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                       (int64_t)in_stack_fffffffffffffbf0,(int64_t)in_stack_fffffffffffffbe8);
  }
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1ac79bd);
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1ac79ca);
  for (local_1c = 0; local_1c < iVar4; local_1c = local_1c + 1) {
    TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 3),(long)local_1c);
    pVar23 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                       ((set<long,_std::less<long>,_std::allocator<long>_> *)
                        in_stack_fffffffffffffbd0,(value_type_conflict5 *)in_stack_fffffffffffffbc8)
    ;
    local_a0 = (_Base_ptr)pVar23.first._M_node;
    local_98 = pVar23.second;
  }
  local_a8._M_node =
       (_List_node_base *)
       std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::begin
                 ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
                  CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  while( true ) {
    local_b0._M_node =
         (_List_node_base *)
         std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::end
                   ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
                    CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    bVar2 = std::operator!=(&local_a8,&local_b0);
    if (!bVar2) break;
    local_b4 = 0;
    while( true ) {
      lVar17 = (long)local_b4;
      pTVar11 = std::_List_iterator<TPZOneShapeRestraint>::operator->
                          ((_List_iterator<TPZOneShapeRestraint> *)0x1ac7afd);
      iVar9 = TPZVec<std::pair<long,_int>_>::size((TPZVec<std::pair<long,_int>_> *)pTVar11);
      if (iVar9 <= lVar17) break;
      pTVar11 = std::_List_iterator<TPZOneShapeRestraint>::operator->
                          ((_List_iterator<TPZOneShapeRestraint> *)0x1ac7b35);
      TPZVec<std::pair<long,_int>_>::operator[]
                ((TPZVec<std::pair<long,_int>_> *)pTVar11,(long)local_b4);
      pVar23 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                         ((set<long,_std::less<long>,_std::allocator<long>_> *)
                          in_stack_fffffffffffffbd0,
                          (value_type_conflict5 *)in_stack_fffffffffffffbc8);
      local_c8 = (_Base_ptr)pVar23.first._M_node;
      local_c0 = pVar23.second;
      local_b4 = local_b4 + 1;
    }
    local_d0 = (_List_node_base *)std::_List_iterator<TPZOneShapeRestraint>::operator++(&local_a8,0)
    ;
  }
  std::set<long,_std::less<long>,_std::allocator<long>_>::operator=
            ((set<long,_std::less<long>,_std::allocator<long>_> *)in_stack_fffffffffffffbb0,
             (set<long,_std::less<long>,_std::allocator<long>_> *)
             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  TPZConnect::BuildConnectList
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  std::set<long,_std::less<long>,_std::allocator<long>_>::size
            ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1ac7c24);
  TPZVec<long>::resize
            ((TPZVec<long> *)in_stack_fffffffffffffbb0,
             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  local_d8 = (_Base_ptr)
             std::set<long,_std::less<long>,_std::allocator<long>_>::begin
                       ((set<long,_std::less<long>,_std::allocator<long>_> *)
                        CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  for (local_e0 = 0; uVar1 = local_e0,
      sVar12 = std::set<long,_std::less<long>,_std::allocator<long>_>::size
                         ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1ac7c74),
      uVar1 < sVar12; local_e0 = local_e0 + 1) {
    plVar13 = std::_Rb_tree_const_iterator<long>::operator*
                        ((_Rb_tree_const_iterator<long> *)0x1ac7c95);
    lVar17 = *plVar13;
    plVar14 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x11),local_e0);
    *plVar14 = lVar17;
    local_e8 = (_Base_ptr)
               std::_Rb_tree_const_iterator<long>::operator++
                         ((_Rb_tree_const_iterator<long> *)in_stack_fffffffffffffbb8,
                          (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
  }
  iVar9 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x11));
  iVar4 = (int)iVar9;
  TPZVec<int>::TPZVec(&local_108);
  TPZElementMatrix::BuildDependencyOrder
            ((TPZElementMatrix *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
             (TPZVec<long> *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
             in_stack_fffffffffffffc08);
  TPZBlock::SetNBlocks(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
  local_110 = 0;
  for (local_1c = 0; local_1c < iVar4; local_1c = local_1c + 1) {
    TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x11),(long)local_1c);
    TPZCompMesh::ConnectVec((TPZCompMesh *)in_RDI[2]);
    pTVar15 = TPZChunkVector<TPZConnect,_10>::operator[]
                        ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffbd0,
                         (int64_t)in_stack_fffffffffffffbc8);
    iVar5 = TPZConnect::NDof(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    bVar3 = TPZConnect::NState(pTVar15);
    uVar6 = TPZConnect::NShape(pTVar15);
    if (iVar5 != bVar3 * uVar6) {
      pzinternal::DebugStopImpl(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    TPZBlock::Set(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20),
                  (int)in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
    local_110 = iVar5 + local_110;
  }
  TPZBlock::Resequence(in_stack_fffffffffffffbc8,(int)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
  TPZBlock::SetMatrix((TPZBlock *)(in_RDI + 0x1020),(TPZBaseMatrix *)(in_RDI + 0x83c));
  iVar9 = TPZBaseMatrix::Cols((TPZBaseMatrix *)(in_RDI + 0x3e));
  if ((int)in_RDI[1] == 2) {
    TPZFMatrix<std::complex<double>_>::Redim
              (in_stack_fffffffffffffc18,(int64_t)in_stack_fffffffffffffc10,
               (int64_t)in_stack_fffffffffffffc08);
  }
  else {
    TPZFMatrix<std::complex<double>_>::Redim
              (in_stack_fffffffffffffc18,(int64_t)in_stack_fffffffffffffc10,
               (int64_t)in_stack_fffffffffffffc08);
  }
  iVar16 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 3));
  for (local_1c = 0; local_1c < (int)iVar16; local_1c = local_1c + 1) {
    local_138 = 0;
    plVar14 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 3),(long)local_1c);
    lVar17 = *plVar14;
    while( true ) {
      bVar2 = false;
      if (local_138 < iVar4) {
        plVar14 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x11),(long)local_138);
        bVar2 = *plVar14 != lVar17;
      }
      if (!bVar2) break;
      local_138 = local_138 + 1;
    }
    iVar5 = TPZBlock::Position((TPZBlock *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
    lVar17 = (long)iVar5;
    iVar5 = TPZBlock::Size((TPZBlock *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
    TPZBlock::Position((TPZBlock *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
    local_160 = lVar17;
    if ((int)in_RDI[1] == 1) {
      for (; local_160 < lVar17 + iVar5; local_160 = local_160 + 1) {
        for (local_170 = 0; local_170 < iVar9; local_170 = local_170 + 1) {
          pcVar18 = TPZFMatrix<std::complex<double>_>::operator()
                              ((TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffbd0,
                               (int64_t)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
          pcVar19 = TPZFMatrix<std::complex<double>_>::operator()
                              ((TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffbd0,
                               (int64_t)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
          *(undefined8 *)pcVar19->_M_value = *(undefined8 *)pcVar18->_M_value;
          *(undefined8 *)(pcVar19->_M_value + 8) = *(undefined8 *)(pcVar18->_M_value + 8);
        }
      }
    }
    else {
      for (local_174 = 0; local_174 < (int)iVar16; local_174 = local_174 + 1) {
        local_178 = 0;
        plVar14 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 3),(long)local_174);
        lVar21 = *plVar14;
        while( true ) {
          bVar2 = false;
          if (local_178 < iVar4) {
            plVar14 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x11),(long)local_178);
            bVar2 = *plVar14 != lVar21;
          }
          if (!bVar2) break;
          local_178 = local_178 + 1;
        }
        if (local_178 == iVar4) {
          poVar10 = std::operator<<((ostream *)&std::cout,"node not found in node list");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        }
        iVar7 = TPZBlock::Position((TPZBlock *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
        iVar8 = TPZBlock::Size((TPZBlock *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
        TPZBlock::Position((TPZBlock *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
        for (local_160 = lVar17; local_1a0 = (long)iVar7, local_160 < lVar17 + iVar5;
            local_160 = local_160 + 1) {
          for (; local_1a0 < (long)iVar7 + (long)iVar8; local_1a0 = local_1a0 + 1) {
            pcVar18 = TPZFMatrix<std::complex<double>_>::operator()
                                ((TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffbd0,
                                 (int64_t)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
            pcVar19 = TPZFMatrix<std::complex<double>_>::operator()
                                ((TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffbd0,
                                 (int64_t)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
            *(undefined8 *)pcVar19->_M_value = *(undefined8 *)pcVar18->_M_value;
            *(undefined8 *)(pcVar19->_M_value + 8) = *(undefined8 *)(pcVar18->_M_value + 8);
          }
        }
      }
    }
  }
  local_1ac = 0;
  local_1b0 = 0;
  while (local_1ac < iVar4) {
    for (local_1b4 = 0; local_1b4 < iVar4; local_1b4 = local_1b4 + 1) {
      TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x11),(long)local_1b4);
      TPZCompMesh::ConnectVec((TPZCompMesh *)in_RDI[2]);
      pTVar15 = TPZChunkVector<TPZConnect,_10>::operator[]
                          ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffbd0,
                           (int64_t)in_stack_fffffffffffffbc8);
      piVar20 = TPZVec<int>::operator[](&local_108,(long)local_1b4);
      if (*piVar20 == local_1b0) {
        local_1ac = local_1ac + 1;
        iVar5 = TPZBlock::Position((TPZBlock *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
        lVar17 = (long)iVar5;
        iVar5 = TPZBlock::Size((TPZBlock *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
        for (local_1e0 = TPZConnect::FirstDepend(pTVar15); local_1e0 != (TPZDepend *)0x0;
            local_1e0 = local_1e0->fNext) {
          lVar21 = local_1e0->fDepConnectIndex;
          local_1ec = 0;
          while( true ) {
            bVar2 = false;
            if (local_1ec < iVar4) {
              plVar14 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x11),(long)local_1ec);
              bVar2 = *plVar14 != lVar21;
            }
            if (!bVar2) break;
            local_1ec = local_1ec + 1;
          }
          if (local_1ec == iVar4) {
            poVar10 = std::operator<<((ostream *)&std::cout,"node not found in node list");
            std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          }
          iVar7 = TPZBlock::Position((TPZBlock *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac
                                    );
          lVar21 = (long)iVar7;
          iVar7 = TPZBlock::Size((TPZBlock *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
          bVar3 = TPZConnect::NState(pTVar15);
          uVar6 = (uint)bVar3;
          for (local_208 = lVar17; local_210 = lVar21, local_208 < lVar17 + iVar5;
              local_208 = (int)uVar6 + local_208) {
            for (; local_210 < lVar21 + iVar7; local_210 = (int)uVar6 + local_210) {
              TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffbd0,(int64_t)in_stack_fffffffffffffbc8,
                         in_stack_fffffffffffffbc0);
              if ((int)in_RDI[1] == 2) {
                for (local_214 = 0; local_214 < local_110; local_214 = local_214 + 1) {
                  for (local_224 = 0; local_224 < (int)uVar6; local_224 = local_224 + 1) {
                    TPZFMatrix<std::complex<double>_>::operator()
                              ((TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffbd0,
                               (int64_t)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
                    std::operator*((double *)
                                   CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                                   (complex<double> *)0x1ac8ae0);
                    TPZFMatrix<std::complex<double>_>::operator()
                              ((TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffbd0,
                               (int64_t)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
                    std::complex<double>::operator+=
                              ((complex<double> *)in_stack_fffffffffffffbb0,
                               (complex<double> *)
                               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
                  }
                }
              }
              else {
                for (local_214 = 0; local_214 < iVar9; local_214 = local_214 + 1) {
                  for (local_224 = 0; local_224 < (int)uVar6; local_224 = local_224 + 1) {
                    TPZFMatrix<std::complex<double>_>::operator()
                              ((TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffbd0,
                               (int64_t)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
                    std::operator*((double *)
                                   CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                                   (complex<double> *)0x1ac8c13);
                    TPZFMatrix<std::complex<double>_>::operator()
                              ((TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffbd0,
                               (int64_t)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
                    std::complex<double>::operator+=
                              ((complex<double> *)in_stack_fffffffffffffbb0,
                               (complex<double> *)
                               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
                  }
                }
              }
            }
          }
          local_208 = lVar17;
          if ((int)in_RDI[1] == 2) {
            for (; local_210 = lVar21, local_208 < lVar17 + iVar5;
                local_208 = (int)uVar6 + local_208) {
              for (; local_210 < lVar21 + iVar7; local_210 = (int)uVar6 + local_210) {
                in_stack_fffffffffffffbd0 =
                     (TPZFMatrix<double> *)
                     TPZFMatrix<double>::operator()
                               (in_stack_fffffffffffffbd0,(int64_t)in_stack_fffffffffffffbc8,
                                in_stack_fffffffffffffbc0);
                for (local_214 = 0; local_214 < local_110; local_214 = local_214 + 1) {
                  for (local_224 = 0; local_224 < (int)uVar6; local_224 = local_224 + 1) {
                    in_stack_fffffffffffffbc8 =
                         (TPZBlock *)
                         TPZFMatrix<std::complex<double>_>::operator()
                                   ((TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffbd0,
                                    (int64_t)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
                    std::operator*((double *)
                                   CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                                   (complex<double> *)0x1ac8e5d);
                    in_stack_fffffffffffffbc0 = col;
                    in_stack_fffffffffffffbb0 =
                         (TPZCompMesh *)
                         TPZFMatrix<std::complex<double>_>::operator()
                                   ((TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffbd0,
                                    (int64_t)in_stack_fffffffffffffbc8,col);
                    std::complex<double>::operator+=
                              ((complex<double> *)in_stack_fffffffffffffbb0,
                               (complex<double> *)
                               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
                  }
                }
              }
            }
          }
        }
        sVar22 = std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::
                 size((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
                      in_stack_fffffffffffffbb0);
        if (sVar22 != 0) {
          (**(code **)(*in_RDI + 0x38))(in_RDI,local_1b4);
        }
      }
    }
    local_1b0 = local_1b0 + 1;
  }
  TPZVec<int>::~TPZVec((TPZVec<int> *)in_stack_fffffffffffffbb0);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1ac8fdd);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)0x1ac8fea);
  return;
}

Assistant:

void TPZElementMatrixT<TVar>::ApplyConstraints(){
	
	if (this->fMat.Rows() == 0){
		LOGPZ_FATAL(logger, "this->fMat not initialized");
	}
	
	int totalnodes= this->NConnects();
	this->fConstrConnect.Resize(totalnodes);
	if(totalnodes) this->fConstrConnect.Fill(0,0);
	int in;
    std::set<int64_t> origlist,connectlist;
	for(in=0; in<totalnodes; in++) connectlist.insert(this->fConnect[in]);
    for (std::list<TPZOneShapeRestraint>::iterator it = fOneRestraints.begin(); it != fOneRestraints.end(); it++) {
        for (int c=0; c< it->fFaces.size(); c++) {
            connectlist.insert(it->fFaces[c].first);
        }
    }
    origlist = connectlist;
	// total number of nodes of the constrained element
	TPZConnect::BuildConnectList(connectlist, origlist, *this->fMesh);
    this->fConstrConnect.resize(connectlist.size());
    std::set<int64_t>::iterator it = connectlist.begin();
    for (int64_t i=0; i<connectlist.size(); i++) {
        fConstrConnect[i] = *it;
        it++;
    }
	totalnodes = this->fConstrConnect.NElements();
	
	// compute the list of nodes and their proper order of processing
	TPZVec<int> DependenceOrder;
	// this->fConstrNod, totalnodes and DependenceOrder
	// are initialized using codes documented above
	BuildDependencyOrder(this->fConstrConnect,DependenceOrder,*this->fMesh);
	
	// compute the number of statevariables
	// the number of state variables is the number of unknowns associated with
	// each shapefunction
	// numstate is best initialized during computation of the stiffness matrix
	//   TPZMaterial * mat = Material();
	//   int numstate = mat->NStateVariables();
	
	// initialize the block structure
	this->fConstrBlock.SetNBlocks(totalnodes);
	
	// toteq contains the total number of equations of the constrained matrix
	int64_t toteq = 0;
	for(in=0; in<totalnodes; in++) {
		int64_t dfnindex = this->fConstrConnect[in];
		TPZConnect &dfn = fMesh->ConnectVec()[dfnindex];
		int ndf = dfn.NDof(*fMesh);
        int ndfcheck = dfn.NState()*dfn.NShape();
        if(ndf != ndfcheck)
        {
            DebugStop();
        }
		this->fConstrBlock.Set(in,ndf);
		toteq += ndf;
	}
	
	this->fConstrBlock.Resequence();
	this->fConstrBlock.SetMatrix(&this->fConstrMat);
	    
	int64_t nrhs = this->fMat.Cols();
	if (this->fType == TPZElementMatrix::EK){
		this->fConstrMat.Redim(toteq,toteq);
	}
	else{
		this->fConstrMat.Redim(toteq,nrhs);
	}
	
	// copy the original matrix to the constrained matrix
	int numnod = this->fConnect.NElements();
	for(in=0; in<numnod; in++) {
		int irnode =0;
		int64_t idfn = this->fConnect[in];
		// find the index of the node in the destination (constrained) matrix
		while(irnode < totalnodes && this->fConstrConnect[irnode] != idfn) irnode++;
		
		// first and last rows in the original matrix
		int64_t ifirst = this->fBlock.Position(in);
		int64_t ilast = ifirst+this->fBlock.Size(in);
		
		// first and last rows in the desination (reception) matrix
		int64_t irfirst = this->fConstrBlock.Position(irnode);
		//	   int irlast = irfirst+this->fConstrBlock->Size(irnode);
		
		int64_t i,ir,ieq;
		if (this->fType == TPZElementMatrix::EF){
			for(i=ifirst,ir=irfirst;i<ilast;i++,ir++) {
				for(ieq=0; ieq<nrhs; ieq++) {
					(this->fConstrMat)(ir,ieq) = (this->fMat)(i,ieq);
				}
			}
		}
		else{
			int jn;
			for(jn=0; jn<numnod; jn++) {
				int jrnode = 0;
				int64_t jdfn = this->fConnect[jn];
				// find the index of the node in the destination (constrained) matrix
				while(jrnode < totalnodes && this->fConstrConnect[jrnode] != jdfn) jrnode++;
				if(jrnode == totalnodes) {
					LOGPZ_ERROR(logger, "node not found in node list");
				}
				// first and last columns in the original matrix
				int64_t jfirst = this->fBlock.Position(jn);
				int64_t jlast = jfirst+this->fBlock.Size(jn);
				// first and last columns in the desination (reception) matrix
				int64_t jrfirst = this->fConstrBlock.Position(jrnode);
				//int jrlast = irfirst+this->fConstrBlock->Size(jrnode);
				int64_t j,jr;
				for(i=ifirst,ir=irfirst;i<ilast; i++,ir++) {
					for(j=jfirst,jr=jrfirst;j<jlast; j++,jr++) {
						(this->fConstrMat)(ir,jr) = (this->fMat)(i,j);
					}
				}
			}
		}//else
	}
	
	int numnodes_processed = 0;
	int current_order = 0;
	while(numnodes_processed < totalnodes) {
		int in;
		for(in=0; in<totalnodes; in++) {
			int64_t dfnindex = this->fConstrConnect[in];
			TPZConnect *dfn = &(fMesh->ConnectVec()[dfnindex]);
			if(DependenceOrder[in] != current_order) continue;
			
			// only nodes which have dependency order equal to the
			// current order are processed
			numnodes_processed++;
			
			int64_t inpos = this->fConstrBlock.Position(in);
			int64_t insize = this->fConstrBlock.Size(in);
			// inpos : position of the dependent equation
			// insize : number of equations processed
			
			// loop over the nodes from which dfn depends
			TPZConnect::TPZDepend *dep = dfn->FirstDepend();
			while(dep) {
				int64_t depnodeindex = dep->fDepConnectIndex;
				// look for the index where depnode is found
				int depindex=0;
				while(depindex < totalnodes && this->fConstrConnect[depindex] != depnodeindex) depindex++;
				if(depindex == totalnodes) {
					LOGPZ_ERROR(logger,"node not found in node list");
				}
				
				int64_t deppos = this->fConstrBlock.Position(depindex);
				int64_t depsize = this->fConstrBlock.Size(depindex);
				// deppos : position of the receiving equation
				// depsize : number of receiving equations
				
				// process the rows of the constrained matrix
				int64_t send;
				int64_t receive;
				int ieq;
				STATE coef;
				int idf;
				int numstate = dfn->NState();
				for(send=inpos; send<inpos+insize; send += numstate) {
					for(receive=deppos; receive<deppos+depsize; receive += numstate) {
						coef = dep->fDepMatrix((send-inpos)/numstate,(receive-deppos)/numstate);
						if (this->fType == TPZElementMatrix::EK){
							for(ieq=0; ieq<toteq; ieq++) for(idf=0; idf<numstate; idf++)  {
								(this->fConstrMat)(receive+idf,ieq) += coef*(this->fConstrMat)(send+idf,ieq);
							}
						}//EK
						else{
							for(ieq=0; ieq<nrhs; ieq++) for(idf=0; idf<numstate; idf++) {
								(this->fConstrMat)(receive+idf,ieq) += coef*(this->fConstrMat)(send+idf,ieq);
							}
						}//EF
					}
				}
				
				if (this->fType == TPZElementMatrix::EK){
					for(send=inpos; send<inpos+insize; send += numstate) {
						for(receive=deppos; receive<deppos+depsize; receive += numstate) {
							coef = dep->fDepMatrix((send-inpos)/numstate,(receive-deppos)/numstate);
							for(ieq=0; ieq<toteq; ieq++) for(idf=0; idf<numstate; idf++) {
								(this->fConstrMat)(ieq,receive+idf) += coef*(this->fConstrMat)(ieq,send+idf);
							}
						}
					}
				}//EK
				
				dep = dep->fNext;
			} // end of while
            
            /// check whether the connect has a one shape restraint
            if (fOneRestraints.size())
            {
                ApplyOneShapeConstraints(in);
            }
            
            
		} // end of loop over all nodes
		current_order++;
	} // end of while loop
}